

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  char __c;
  pointer pcVar1;
  pointer pMVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined4 uVar7;
  pointer pCVar8;
  bool bVar9;
  __type _Var10;
  int iVar11;
  int iVar12;
  int32_t iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  pointer pUVar18;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *this;
  ImGuiIO *pIVar19;
  ulong uVar20;
  pointer pUVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  char *__s;
  int i;
  int iVar25;
  uint uVar26;
  pointer pCVar27;
  User *user;
  pointer pcVar28;
  allocator<char> local_572;
  allocator<char> local_571;
  allocator<char> local_570;
  allocator<char> local_56f;
  allocator<char> local_56e;
  allocator<char> local_56d;
  allocator<char> local_56c;
  allocator<char> local_56b;
  allocator<char> local_56a;
  allocator<char> local_569;
  allocator<char> local_568;
  allocator<char> local_567;
  allocator<char> local_566;
  allocator<char> local_565;
  allocator<char> local_564;
  allocator<char> local_563;
  allocator<char> local_562;
  allocator<char> local_561;
  pointer local_560;
  pointer local_558;
  int local_550;
  allocator<char> local_54a;
  allocator<char> local_549;
  vector<Log,_std::allocator<Log>_> logs;
  string text;
  undefined1 local_4e0 [40];
  undefined8 local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b0;
  pointer local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 local_468;
  undefined4 local_464;
  string local_460 [8];
  string local_458 [24];
  string local_440 [8];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0;
  undefined4 local_3ec;
  string local_3e8 [16];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  undefined2 local_3bc;
  string local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined4 local_360;
  undefined2 local_35c;
  string local_358 [8];
  string local_350 [24];
  string local_338 [8];
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  uint local_300;
  uint local_2fc;
  string local_2f8 [32];
  string local_2d8 [32];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288;
  undefined4 local_284;
  string local_280 [8];
  string local_278 [24];
  string local_260 [8];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210;
  undefined4 local_20c;
  string local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined2 local_1dc;
  string local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined2 local_17c;
  string local_178 [8];
  string local_170 [24];
  string local_158 [8];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined4 local_11c;
  string local_118 [32];
  string local_f8 [32];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined4 local_a4;
  string local_a0 [32];
  string local_80 [32];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_4e0._0_4_ = local_4e0._0_4_ & 0xffffff00;
  local_4e0._4_4_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_4e0 + 8),"compiler",(allocator<char> *)&text);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"A channel about the compiler",(allocator<char> *)&logs);
  local_464 = 0;
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_478 = 0;
  uStack_470 = 0;
  local_468 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_460,"random",&local_561);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"Random thoughts",&local_562);
  local_3ec = 0;
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  uStack_408 = 0;
  local_400 = 0;
  uStack_3f8 = 0;
  local_3f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"general",&local_563);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"The main channel about ImTui",&local_564);
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_378 = CONCAT71(local_378._1_7_,1);
  local_378 = local_378 & 0xffffffff;
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_370,"rust",&local_565);
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"Tell us how great this language is",&local_566);
  local_2fc = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = local_300 & 0xffffff00;
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"c++",&local_567);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"The best language",&local_568);
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_288 = 0;
  local_284 = 2;
  std::__cxx11::string::string<std::allocator<char>>(local_280,"imtui",&local_569);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"The best TUI library",&local_56a);
  local_20c = 0;
  local_240 = 0;
  uStack_238 = 0;
  local_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  uStack_218 = 0;
  local_210 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_208,"reddit",&local_56b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Dive into anything",&local_56c);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = (ulong)(uint3)((uint)(undefined4)local_198 >> 8) << 8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_190,"hn",&local_56d);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"Hacker News",&local_56e);
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_120 = CONCAT31(local_120._1_3_,1);
  local_11c = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"news",&local_56f);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"Mainstream media news",&local_570);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_a8 = 0;
  local_a4 = 3;
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"builds",&local_571);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"Build reports",&local_572);
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  std::vector<Channel,std::allocator<Channel>>::_M_assign_aux<Channel_const*>
            ((vector<Channel,std::allocator<Channel>> *)&g_ui.channels,local_4e0);
  lVar24 = 0x438;
  do {
    Channel::~Channel((Channel *)(local_4e0 + lVar24));
    lVar24 = lVar24 + -0x78;
  } while (lVar24 != -0x78);
  g_ui.selectedChannel = 2;
  local_4e0._0_4_ = 0;
  local_4e0._4_2_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_4e0 + 8),"Georgi Gerganov",(allocator<char> *)&text);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"",(allocator<char> *)&logs);
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  uStack_480 = CONCAT26(uStack_480._6_2_,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"John Doe",&local_561);
  std::__cxx11::string::string<std::allocator<char>>(local_458,"",&local_562);
  local_438 = 0;
  uStack_430 = 0;
  local_428 = 0;
  local_420 = CONCAT26(local_420._6_2_,2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_418,"Betty Basil",&local_563)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_3f8,"",&local_564);
  local_3c8 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3c0 = 3;
  local_3bc = 0x101;
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"Chace Jordana",&local_565);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_566);
  local_368 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_360 = 4;
  local_35c = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_358,"Elon Musk",&local_567);
  std::__cxx11::string::string<std::allocator<char>>(local_338,"",&local_568);
  uStack_318 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = 5;
  local_2fc = local_2fc & 0xffff0000;
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"Vin Kennedi",&local_569);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"",&local_56a);
  local_2a8 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  uStack_2a0 = CONCAT26(uStack_2a0._6_2_,0x100000006);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Kilie Katlyn",&local_56b)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_278,"",&local_56c);
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  local_240 = CONCAT26(local_240._6_2_,7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_238,"Kaeden Gil",&local_56d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&uStack_218,"",&local_56e);
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  local_1e0 = 8;
  local_1dc = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"Mary Jane",&local_56f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_570);
  local_188 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_180 = 9;
  local_17c = 0x101;
  std::__cxx11::string::string<std::allocator<char>>(local_178,"Adair Rigby",&local_571);
  std::__cxx11::string::string<std::allocator<char>>(local_158,"",&local_572);
  uStack_128 = 0;
  uStack_138 = 0;
  local_130 = 0;
  local_120 = 10;
  local_11c = CONCAT22(local_11c._2_2_,1);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"Bryce Bekki",&local_549);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"",&local_54a);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<User,std::allocator<User>>::_M_assign_aux<User_const*>
            ((vector<User,std::allocator<User>> *)&g_ui.users,local_4e0);
  lVar24 = 0x3c0;
  do {
    User::~User((User *)(local_4e0 + lVar24));
    pUVar21 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar24 = lVar24 + -0x60;
  } while (lVar24 != -0x60);
  g_ui.selectedUser = -1;
  for (pUVar18 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                 super__Vector_impl_data._M_start; pUVar18 != pUVar21; pUVar18 = pUVar18 + 1) {
    iVar11 = rand();
    lVar24 = (long)g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                   super__Vector_impl_data._M_start;
    for (iVar25 = 0; iVar25 < (int)((ulong)(long)iVar11 % (ulong)(lVar24 / 0x78)) + 1;
        iVar25 = iVar25 + 1) {
      do {
        iVar12 = rand();
        iVar12 = (int)((ulong)(long)iVar12 %
                      (ulong)(((long)g_ui.channels.
                                     super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)g_ui.channels.
                                    super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                    super__Vector_impl_data._M_start) / 0x78));
        bVar9 = Channel::isMember(g_ui.channels.
                                  super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                  super__Vector_impl_data._M_start + iVar12,pUVar18->id);
      } while (bVar9);
      std::vector<User,_std::allocator<User>_>::push_back
                (&g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar12].members,pUVar18);
    }
  }
  logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_558 = (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  pUVar21 = (pointer)kLogs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                     super__Vector_impl_data._M_start;
  do {
    pCVar8 = g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar27 = g_ui.channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pUVar21 == local_558) {
      for (; pUVar21 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                       super__Vector_impl_data._M_finish,
          pUVar18 = g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                    super__Vector_impl_data._M_start, pCVar27 != pCVar8; pCVar27 = pCVar27 + 1) {
        iVar13 = tGet();
        iVar11 = rand();
        iVar25 = iVar13 + (iVar11 % 100) * -0x15180 + -0xd2f00;
        iVar11 = rand();
        uVar20 = (ulong)((int)((ulong)(long)iVar11 %
                              (((long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 6) - 2U)) + 1);
        iVar11 = rand();
        local_550 = iVar11 % 100;
        if (iVar11 % 100 < -9) {
          local_550 = -10;
        }
        local_550 = local_550 + 10;
        uVar22 = 0xffffffffffffffff;
        for (iVar11 = 0; iVar11 != local_550; iVar11 = iVar11 + 1) {
          lVar24 = (long)(int)uVar20;
          _Var10 = std::operator==(&logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar24 + -1].username,
                                   &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar24].username);
          if ((int)uVar22 == -1) goto LAB_00113270;
          pUVar21 = (pointer)(uVar22 & 0xffffffff);
          if (!_Var10) goto LAB_00113270;
          while ((int)pUVar21 == (int)uVar22 && !_Var10) {
LAB_00113270:
            iVar12 = rand();
            pUVar21 = (pointer)((ulong)(long)iVar12 %
                               (ulong)(((long)g_ui.users.
                                              super__Vector_base<User,_std::allocator<User>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)g_ui.users.
                                             super__Vector_base<User,_std::allocator<User>_>._M_impl
                                             .super__Vector_impl_data._M_start) / 0x60));
          }
          local_560 = pUVar21;
          iVar12 = rand();
          iVar16 = 0xe10;
          if (_Var10) {
            iVar16 = 0x3c;
          }
          iVar14 = rand();
          local_558 = (pointer)((ulong)local_558 & 0xffffffff00000000);
          iVar15 = 0;
          if (0x50 < iVar14 % 100) {
            iVar15 = rand();
            iVar15 = iVar15 % 5;
          }
          iVar14 = rand();
          if (0x5a < iVar14 % 100) {
            iVar14 = rand();
            local_558 = (pointer)CONCAT44(local_558._4_4_,iVar14 % 5);
          }
          iVar25 = iVar12 % iVar16 + iVar25;
          _Var10 = std::operator==(&logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar24 + 1].username,
                                   &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar24].username);
          local_4e0._4_4_ = SUB84(local_560,0);
          local_4e0._0_4_ = iVar25;
          std::__cxx11::string::string
                    ((string *)(local_4e0 + 8),
                     &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar24].text);
          uVar7 = (int)local_558;
          if (_Var10) {
            iVar15 = 0;
            uVar7 = 0;
          }
          local_4b8 = CONCAT44(uVar7,iVar15);
          aStack_4b0._M_allocated_capacity = 0;
          aStack_4b0._8_8_ = 0;
          local_4a0 = (pointer)0x0;
          std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
          emplace_back<MessageWithReplies>(&pCVar27->messages,(MessageWithReplies *)local_4e0);
          MessageWithReplies::~MessageWithReplies((MessageWithReplies *)local_4e0);
          iVar12 = rand();
          iVar16 = 0;
          if (0x5a < iVar12 % 100) {
            iVar16 = rand();
            iVar16 = iVar16 % 0x1e;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          while( true ) {
            bVar9 = iVar16 == 0;
            iVar16 = iVar16 + -1;
            if (bVar9) break;
            iVar12 = rand();
            auVar3._8_4_ = 0;
            auVar3._0_8_ = ((long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 6) - 1;
            auVar6._8_4_ = 0;
            auVar6._0_8_ = (long)((int)uVar20 + 1);
            uVar20 = SUB128(auVar6 % auVar3,0);
            if (SUB124(auVar6 % auVar3,0) < 2) {
              uVar20 = 1;
            }
            iVar14 = rand();
            if (0x50 < iVar14 % 100) {
              rand();
            }
            iVar14 = rand();
            if (0x5a < iVar14 % 100) {
              rand();
            }
            iVar25 = iVar25 + iVar12 % 0x3c;
            pMVar2 = (pCVar27->messages).
                     super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_4e0._0_4_ = iVar25;
            iVar12 = rand();
            local_4e0._4_4_ =
                 (undefined4)
                 ((ulong)(long)iVar12 %
                 (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x60));
            std::__cxx11::string::string
                      ((string *)(local_4e0 + 8),
                       &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar20 & 0xffffffff].text);
            aStack_4b0._8_8_ = 0;
            local_4a0 = (pointer)0x0;
            local_4b8 = 0;
            aStack_4b0._M_allocated_capacity = 0;
            std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
            emplace_back<MessageWithReplies>(&pMVar2[-1].replies,(MessageWithReplies *)local_4e0);
            MessageWithReplies::~MessageWithReplies((MessageWithReplies *)local_4e0);
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = ((long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                super__Vector_impl_data._M_start >> 6) - 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (long)((int)uVar20 + 1);
          uVar20 = SUB168(auVar5 % auVar4,0);
          if (SUB164(auVar5 % auVar4,0) < 2) {
            uVar20 = 1;
          }
          uVar20 = uVar20 & 0xffffffff;
          uVar22 = (ulong)local_560 & 0xffffffff;
        }
      }
      do {
        if (pUVar18 == pUVar21) {
          std::vector<Log,_std::allocator<Log>_>::~vector(&logs);
          ImGui::DebugCheckVersionAndDataLayout("1.81",0x1558,0x414,8,0x10,0x14,2);
          ImGui::CreateContext((ImFontAtlas *)0x0);
          UI::setStyle(&g_ui,EStyle_Dark);
          pIVar19 = ImGui::GetIO();
          pIVar19->IniFilename = (char *)0x0;
          g_screen = ImTui_ImplNcurses_Init(true,60.0,3.0);
          ImTui_ImplText_Init();
          while (g_isRunning == true) {
            render_frame();
          }
          ImTui_ImplText_Shutdown();
          ImTui_ImplNcurses_Shutdown();
          return 0;
        }
        local_560 = pUVar18;
        if (*(int *)&(((string *)&pUVar18->id)->_M_dataplus)._M_p != 0) {
          iVar13 = tGet();
          iVar11 = rand();
          local_558 = (pointer)CONCAT44(local_558._4_4_,
                                        (iVar11 % 100) * -0x15180 + iVar13 + -0xd2f00);
          iVar11 = rand();
          iVar12 = 0;
          iVar25 = (int)((ulong)(long)iVar11 %
                        (((long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                super__Vector_impl_data._M_start >> 6) - 2U)) + 1;
          iVar11 = rand();
          iVar11 = iVar11 % 100;
          this = &local_560->messages;
          if (iVar11 < -9) {
            iVar11 = -10;
          }
          uVar20 = 0xffffffffffffffff;
          for (; iVar12 != iVar11 + 10; iVar12 = iVar12 + 1) {
            lVar24 = (long)iVar25;
            _Var10 = std::operator==(&logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar24 + -1].username,
                                     &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar24].username);
            if (((uint)uVar20 == 0xffffffff) || (uVar22 = uVar20 & 0xffffffff, !_Var10)) {
              iVar25 = rand();
              uVar22 = (ulong)(long)iVar25 %
                       (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                     _M_impl.super__Vector_impl_data._M_start) / 0x60);
            }
            uVar23 = uVar22 & 0xffffffff;
            while (uVar26 = (uint)uVar23, !_Var10) {
              if ((uVar26 != (uint)uVar20) &&
                 ((iVar25 = 0xe10, uVar26 == 0 ||
                  (uVar26 == *(uint *)&(((string *)&local_560->id)->_M_dataplus)._M_p))))
              goto LAB_00113455;
              iVar25 = rand();
              uVar23 = (ulong)(long)iVar25 %
                       (ulong)(((long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)g_ui.users.super__Vector_base<User,_std::allocator<User>_>.
                                     _M_impl.super__Vector_impl_data._M_start) / 0x60);
            }
            iVar25 = 0x3c;
            uVar26 = (uint)uVar22;
LAB_00113455:
            iVar14 = rand();
            iVar15 = rand();
            iVar16 = 0;
            iVar17 = 0;
            if (0x50 < iVar15 % 100) {
              iVar17 = rand();
              iVar17 = iVar17 % 5;
            }
            local_550 = iVar17;
            iVar15 = rand();
            if (0x5a < iVar15 % 100) {
              iVar16 = rand();
              iVar16 = iVar16 % 5;
            }
            iVar25 = (int)local_558 + iVar14 % iVar25;
            _Var10 = std::operator==(&logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar24 + 1U].username,
                                     &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar24].username);
            local_558 = (pointer)CONCAT44(local_558._4_4_,iVar25);
            local_4e0._0_4_ = iVar25;
            local_4e0._4_4_ = uVar26;
            std::__cxx11::string::string
                      ((string *)(local_4e0 + 8),
                       &logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar24].text);
            iVar25 = local_550;
            if (_Var10) {
              iVar16 = 0;
              iVar25 = 0;
            }
            local_4b8 = CONCAT44(iVar16,iVar25);
            aStack_4b0._M_allocated_capacity = 0;
            aStack_4b0._8_8_ = 0;
            local_4a0 = (pointer)0x0;
            std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::
            emplace_back<MessageWithReplies>(this,(MessageWithReplies *)local_4e0);
            MessageWithReplies::~MessageWithReplies((MessageWithReplies *)local_4e0);
            iVar25 = (int)((lVar24 + 1U) %
                          (((long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)logs.super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 6) - 1U));
            if (iVar25 < 2) {
              iVar25 = 1;
            }
            uVar20 = (ulong)uVar26;
          }
        }
        pUVar18 = local_560 + 1;
      } while( true );
    }
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    lVar24 = *(long *)((long)&(pUVar21->username).field_2 + 8);
    pcVar1 = (pUVar21->bio)._M_dataplus._M_p;
    local_560 = pUVar21;
    text._M_dataplus._M_p = (pointer)&text.field_2;
    for (pcVar28 = (pointer)0x0; pUVar21 = local_560, pcVar1 != pcVar28; pcVar28 = pcVar28 + 1) {
      __c = pcVar28[lVar24];
      __s = "@";
      if (__c < ' ') {
LAB_00112e7f:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&text,__s);
      }
      else {
        if (__c == '&') {
          __s = "@amp;";
          goto LAB_00112e7f;
        }
        __s = "@lt;";
        if (__c == '<') goto LAB_00112e7f;
        if (__c == '>') {
          __s = "@gt;";
          goto LAB_00112e7f;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&text,__c);
      }
    }
    std::__cxx11::string::string
              ((string *)local_4e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
    local_4e0._32_8_ = &aStack_4b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)text._M_dataplus._M_p == &text.field_2) {
      aStack_4b0._8_8_ = text.field_2._8_8_;
    }
    else {
      local_4e0._32_8_ = text._M_dataplus._M_p;
    }
    aStack_4b0._M_allocated_capacity._1_7_ = text.field_2._M_allocated_capacity._1_7_;
    aStack_4b0._M_local_buf[0] = text.field_2._M_local_buf[0];
    local_4b8 = text._M_string_length;
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    text._M_dataplus._M_p = (pointer)&text.field_2;
    std::vector<Log,_std::allocator<Log>_>::emplace_back<Log>(&logs,(Log *)local_4e0);
    Log::~Log((Log *)local_4e0);
    std::__cxx11::string::~string((string *)&text);
    pUVar21 = (pointer)((pUVar21->bio).field_2._M_local_buf + 8);
  } while( true );
}

Assistant:

int main() {
    // initialize some random workspace data
    {
        // channels
        {
            g_ui.channels = {
                { false, 0, "compiler", "A channel about the compiler",       {}, {} },
                { false, 0, "random",   "Random thoughts",                    {}, {} },
                { false, 0, "general",  "The main channel about ImTui",       {}, {} },
                { true,  0, "rust",     "Tell us how great this language is", {}, {} },
                { false, 0, "c++",      "The best language",                  {}, {} },
                { false, 2, "imtui",    "The best TUI library",               {}, {} },
                { false, 0, "reddit",   "Dive into anything",                 {}, {} },
                { false, 0, "hn",       "Hacker News",                        {}, {} },
                { true,  0, "news",     "Mainstream media news",              {}, {} },
                { false, 3, "builds",   "Build reports",                      {}, {} },
            };

            g_ui.selectedChannel = 2;
        }

        // users
        {
            g_ui.users = {
                {  0, true , false, "Georgi Gerganov", "", {}},
                {  1, false, false, "John Doe",        "", {}},
                {  2, false, false, "Betty Basil",     "", {}},
                {  3, true , true,  "Chace Jordana",   "", {}},
                {  4, true , false, "Elon Musk",       "", {}},
                {  5, false, false, "Vin Kennedi",     "", {}},
                {  6, true , false, "Kilie Katlyn",    "", {}},
                {  7, false, false, "Kaeden Gil",      "", {}},
                {  8, false, false, "Mary Jane",       "", {}},
                {  9, true , true,  "Adair Rigby",     "", {}},
                { 10, true , false, "Bryce Bekki",     "", {}},
            };

            g_ui.selectedUser = -1;

            // assign users to random set of channels
            for (auto & user : g_ui.users) {
                const int nMembership = rand()%g_ui.channels.size() + 1;

                for (int i = 0; i < nMembership; i++) {
                    int channelIndex = rand()%g_ui.channels.size();
                    while (g_ui.channels[channelIndex].isMember(user.id)) {
                        channelIndex = rand()%g_ui.channels.size();
                    }
                    g_ui.channels[channelIndex].members.push_back(user);
                }
            }
        }

        // filter the logs, because we only support single-byte strings
        std::vector<Log> logs;
        for (auto & cur : kLogs) {
            std::string text;
            for (auto & ch : cur.text) {
                if (ch < 32) {
                    text += "@";
                } else if (ch == '<') {
                    text += "@lt;";
                } else if (ch == '>') {
                    text += "@gt;";
                } else if (ch == '&') {
                    text += "@amp;";
                } else {
                    text += ch;
                }
            }

            logs.push_back({ cur.username, std::move(text) });
        }

        // generate random channel messages
        for (auto & channel : g_ui.channels) {
            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && uid == lastUid) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                channel.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                // random threads
                const int nReplies = rand()%100 > 90 ? rand()%30 : 0;
                for (int j = 0; j < nReplies; ++j) {
                    t += rand()%60;
                    logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);

                    nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                    nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                    channel.messages.back().replies.push_back({ {
                        t, (int) (rand()%g_ui.users.size()), logs[logId].text, 0, 0,
                    }, {} });
                }

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }

        // generate random DMs
        for (auto & user : g_ui.users) {
            if (user.id == 0) continue;

            auto t = tGet() - 24*3600*(rand()%100 + 10);

            int lastUid = -1;
            int logId = 1 + rand()%(logs.size() - 2);
            const int nMessages = rand()%100 + 10;

            for (int i = 0; i < nMessages; ++i) {
                const bool isSameUser = (logs[logId - 1].username == logs[logId].username);

                int uid = lastUid == -1 || !isSameUser ? rand()%g_ui.users.size() : lastUid;
                while (!isSameUser && (uid == lastUid || (uid != 0 && uid != user.id))) {
                    uid = rand()%g_ui.users.size();
                }
                lastUid = uid;

                if (isSameUser) {
                    t += rand()%60;
                } else {
                    t += rand()%3600;
                }

                int nReactUp   = rand()%100 > 80 ? rand()%5 : 0;
                int nReactDown = rand()%100 > 90 ? rand()%5 : 0;

                if (logs[logId + 1].username == logs[logId].username) {
                    nReactUp = 0;
                    nReactDown = 0;
                }

                user.messages.push_back({ {
                    t, uid, logs[logId].text, nReactUp, nReactDown, }, {}
                });

                logId = std::max((int)((logId + 1)%(logs.size() - 1)), 1);
            }
        }
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

    g_ui.setStyle(UI::EStyle_Dark);

    ImGui::GetIO().IniFilename = nullptr;

#ifdef __EMSCRIPTEN__
    g_screen = ImTui_ImplEmscripten_Init(true);
#else
    // when no changes occured - limit frame rate to 3.0 fps to save CPU
    g_screen = ImTui_ImplNcurses_Init(true, 60.0, 3.0);
#endif

    ImTui_ImplText_Init();

#ifndef __EMSCRIPTEN__
    while (g_isRunning) {
        if (render_frame() == false) break;
    }

    ImTui_ImplText_Shutdown();
    ImTui_ImplNcurses_Shutdown();
#endif

    return 0;
}